

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  size_t new_size;
  size_t old_size;
  LogMessage *in_stack_ffffffffffffff48;
  LogMessage *in_stack_ffffffffffffff50;
  string *s;
  undefined8 in_stack_ffffffffffffff58;
  unsigned_long local_88;
  unsigned_long local_80;
  unsigned_long local_78;
  size_t local_70;
  byte local_51;
  LogMessage local_50;
  int *local_18;
  undefined8 *local_10;
  
  local_51 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 8) == 0) {
    internal::LogMessage::LogMessage
              (&local_50,(LogLevel)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (char *)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    local_51 = 1;
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x44b3e0);
  }
  sVar2 = std::__cxx11::string::size();
  local_70 = sVar2;
  uVar3 = std::__cxx11::string::capacity();
  if (sVar2 < uVar3) {
    local_78 = std::__cxx11::string::capacity();
  }
  else {
    local_78 = local_70 << 1;
  }
  sVar2 = local_70;
  iVar1 = std::numeric_limits<int>::max();
  local_80 = sVar2 + (long)iVar1;
  puVar4 = std::min<unsigned_long>(&local_78,&local_80);
  local_78 = *puVar4;
  s = *(string **)(in_RDI + 8);
  local_88 = 0x10;
  std::max<unsigned_long>(&local_78,&local_88);
  STLStringResizeUninitialized(s,sVar2);
  pcVar5 = mutable_string_data((string *)0x44b4dd);
  *local_10 = pcVar5 + local_70;
  iVar1 = std::__cxx11::string::size();
  *local_18 = iVar1 - (int)local_70;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  GOOGLE_CHECK(target_ != NULL);
  size_t old_size = target_->size();

  // Grow the string.
  size_t new_size;
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    new_size = target_->capacity();
  } else {
    // Size has reached capacity, try to double it.
    new_size = old_size * 2;
  }
  // Avoid integer overflow in returned '*size'.
  new_size = std::min(new_size, old_size + std::numeric_limits<int>::max());
  // Increase the size, also make sure that it is at least kMinimumSize.
  STLStringResizeUninitialized(
      target_,
      std::max(new_size,
               kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}